

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

string * cs_impl::to_string<bool>(bool *v)

{
  byte *in_RSI;
  string *in_RDI;
  allocator local_25 [20];
  allocator local_11 [17];
  
  if ((*in_RSI & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"false",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"true",local_11);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  return in_RDI;
}

Assistant:

std::string to_string<bool>(const bool &v)
	{
		if (v)
			return "true";
		else
			return "false";
	}